

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::CropParameter::CropParameter(CropParameter *this,CropParameter *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CropParameter_0071d240;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  (this->offset_).current_size_ = 0;
  *(undefined8 *)&(this->offset_).total_size_ = 0;
  *(undefined4 *)((long)&(this->offset_).rep_ + 4) = 0;
  new_size = (from->offset_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve(&this->offset_,new_size);
    memcpy(((this->offset_).rep_)->elements,((from->offset_).rep_)->elements,
           (long)(from->offset_).current_size_ << 2);
    (this->offset_).current_size_ = (from->offset_).current_size_;
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->axis_ = from->axis_;
  return;
}

Assistant:

CropParameter::CropParameter(const CropParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      offset_(from.offset_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  axis_ = from.axis_;
  // @@protoc_insertion_point(copy_constructor:caffe.CropParameter)
}